

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
          (PathTypeHandlerBase *this,Type *type,ObjectSlotAttributes *attributes,
          EquivalentPropertyEntry *entry)

{
  ushort uVar1;
  TypePath *this_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  PropertyIndex index;
  ObjectSlotAttributes OVar5;
  ushort uVar6;
  
  index = TypePath::LookupInline
                    ((this->typePath).ptr,entry->propertyId,
                     (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
  if (index == 0xffff) {
    if ((entry->slotIndex == 0xffff) && (entry->mustBeWritable == false)) {
      return true;
    }
    return false;
  }
  if (attributes == (ObjectSlotAttributes *)0x0) {
    OVar5 = ObjectSlotAttr_Default;
  }
  else {
    OVar5 = attributes[index];
  }
  if ((OVar5 & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
    if ((OVar5 & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) goto LAB_00dcf0e3;
    uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    uVar6 = -uVar1;
    if (index < uVar1) {
      uVar6 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
    }
    if ((((ushort)(uVar6 + index) != entry->slotIndex) || (entry->isAuxSlot != uVar1 <= index)) ||
       ((bVar2 = true, entry->mustBeWritable == true &&
        (((OVar5 & ObjectSlotAttr_Writable) == ObjectSlotAttr_None ||
         ((DAT_015d6361 == '\x01' &&
          ((this_00 = (this->typePath).ptr, ((this_00->data).ptr)->maxInitializedLength <= index ||
           (bVar3 = TypePath::GetIsFixedFieldAt
                              (this_00,index,
                               (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1)), bVar3))))
         )))))) goto LAB_00dcf0e3;
  }
  else {
    if (entry->slotIndex == 0xffff) {
      bVar4 = entry->mustBeWritable ^ 1;
      bVar2 = false;
      goto LAB_00dcf0e8;
    }
LAB_00dcf0e3:
    bVar2 = false;
  }
  bVar4 = 0;
LAB_00dcf0e8:
  if (bVar2) {
    return true;
  }
  return (bool)bVar4;
}

Assistant:

bool PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper(const Type* type, const ObjectSlotAttributes * attributes, const EquivalentPropertyEntry *entry)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(entry->propertyId, GetPathLength());

        if (absSlotIndex != Constants::NoSlot)
        {
            ObjectSlotAttributes attr = attributes ? attributes[absSlotIndex] : ObjectSlotAttr_Default;

            if (attr & ObjectSlotAttr_Deleted)
            {
                return entry->slotIndex == Constants::NoSlot && !entry->mustBeWritable;
            }

            if (attr & ObjectSlotAttr_Accessor)
            {
                return false;
            }

            Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(absSlotIndex);
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable)
            {
                if (!(attr & ObjectSlotAttr_Writable))
                {
                    return false;
                }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                int maxInitializedLength = this->GetTypePath()->GetMaxInitializedLength();
                if (FixPropsOnPathTypes() && (absSlotIndex >= maxInitializedLength || this->GetTypePath()->GetIsFixedFieldAt(absSlotIndex, this->GetPathLength())))
                {
                    return false;
                }
#endif
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }